

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

optional<Vault::HttpResponse> * __thiscall
Vault::HttpClient::get
          (optional<Vault::HttpResponse> *__return_storage_ptr__,HttpClient *this,Url *url,
          Token *token,Namespace *ns)

{
  anon_class_1_0_00000001 local_79;
  CurlHeaderCallback local_78;
  anon_class_1_0_00000001 local_51;
  CurlSetupCallback local_50;
  Namespace *local_30;
  Namespace *ns_local;
  Token *token_local;
  Url *url_local;
  HttpClient *this_local;
  
  local_30 = ns;
  ns_local = (Namespace *)token;
  token_local = (Token *)url;
  url_local = (Url *)this;
  this_local = (HttpClient *)__return_storage_ptr__;
  std::function<void(void*)>::
  function<Vault::HttpClient::get(Vault::Tiny<Vault::UrlDetail,std::__cxx11::string>const&,Vault::Tiny<Vault::TokenDetail,std::__cxx11::string>const&,Vault::Tiny<Vault::NamespaceDetail,std::__cxx11::string>const&)const::__0,void>
            ((function<void(void*)> *)&local_50,&local_51);
  std::function<curl_slist*(curl_slist*)>::
  function<Vault::HttpClient::get(Vault::Tiny<Vault::UrlDetail,std::__cxx11::string>const&,Vault::Tiny<Vault::TokenDetail,std::__cxx11::string>const&,Vault::Tiny<Vault::NamespaceDetail,std::__cxx11::string>const&)const::__1,void>
            ((function<curl_slist*(curl_slist*)> *)&local_78,&local_79);
  executeRequest(__return_storage_ptr__,this,url,token,ns,&local_50,&local_78,&this->errorCallback_)
  ;
  std::function<curl_slist_*(curl_slist_*)>::~function(&local_78);
  std::function<void_(void_*)>::~function(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::HttpResponse>
Vault::HttpClient::get(const Vault::Url &url, const Vault::Token &token,
                       const Vault::Namespace &ns) const {
  return executeRequest(
      url, token, ns, [&]([[maybe_unused]] CURL *curl) {},
      [&](curl_slist *chunk) { return chunk; }, errorCallback_);
}